

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# j2k.c
# Opt level: O0

OPJ_BOOL opj_j2k_allocate_tile_element_cstr_index(opj_j2k_t *p_j2k)

{
  opj_tile_index_t *poVar1;
  opj_marker_info_t *poVar2;
  uint local_1c;
  OPJ_UINT32 it_tile;
  opj_j2k_t *p_j2k_local;
  
  p_j2k->cstr_index->nb_of_tiles = (p_j2k->m_cp).tw * (p_j2k->m_cp).th;
  poVar1 = (opj_tile_index_t *)opj_calloc((ulong)p_j2k->cstr_index->nb_of_tiles,0x38);
  p_j2k->cstr_index->tile_index = poVar1;
  if (p_j2k->cstr_index->tile_index == (opj_tile_index_t *)0x0) {
    p_j2k_local._4_4_ = 0;
  }
  else {
    for (local_1c = 0; local_1c < p_j2k->cstr_index->nb_of_tiles; local_1c = local_1c + 1) {
      p_j2k->cstr_index->tile_index[local_1c].maxmarknum = 100;
      p_j2k->cstr_index->tile_index[local_1c].marknum = 0;
      poVar2 = (opj_marker_info_t *)
               opj_calloc((ulong)p_j2k->cstr_index->tile_index[local_1c].maxmarknum,0x18);
      p_j2k->cstr_index->tile_index[local_1c].marker = poVar2;
      if (p_j2k->cstr_index->tile_index[local_1c].marker == (opj_marker_info_t *)0x0) {
        return 0;
      }
    }
    p_j2k_local._4_4_ = 1;
  }
  return p_j2k_local._4_4_;
}

Assistant:

static OPJ_BOOL opj_j2k_allocate_tile_element_cstr_index(opj_j2k_t *p_j2k)
{
    OPJ_UINT32 it_tile = 0;

    p_j2k->cstr_index->nb_of_tiles = p_j2k->m_cp.tw * p_j2k->m_cp.th;
    p_j2k->cstr_index->tile_index = (opj_tile_index_t*)opj_calloc(
                                        p_j2k->cstr_index->nb_of_tiles, sizeof(opj_tile_index_t));
    if (!p_j2k->cstr_index->tile_index) {
        return OPJ_FALSE;
    }

    for (it_tile = 0; it_tile < p_j2k->cstr_index->nb_of_tiles; it_tile++) {
        p_j2k->cstr_index->tile_index[it_tile].maxmarknum = 100;
        p_j2k->cstr_index->tile_index[it_tile].marknum = 0;
        p_j2k->cstr_index->tile_index[it_tile].marker = (opj_marker_info_t*)
                opj_calloc(p_j2k->cstr_index->tile_index[it_tile].maxmarknum,
                           sizeof(opj_marker_info_t));
        if (!p_j2k->cstr_index->tile_index[it_tile].marker) {
            return OPJ_FALSE;
        }
    }

    return OPJ_TRUE;
}